

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label-utils.h
# Opt level: O0

void __thiscall wasm::LabelUtils::LabelManager::LabelManager(LabelManager *this,Function *func)

{
  Function *func_local;
  LabelManager *this_local;
  
  PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>::
  PostWalker(&this->
              super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
            );
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set(&this->labels);
  this->counter = 0;
  Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>::
  walkFunction((Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
                *)this,func);
  return;
}

Assistant:

LabelManager(Function* func) { walkFunction(func); }